

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_then_insert(planck_unit_test_t *tc)

{
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_edge_cases);
  local_84 = 0x3c;
  bhdct_delete(tc,&dict,&local_84,'\0',1,'\x01');
  local_88 = 4;
  bhdct_delete(tc,&dict,&local_88,'\0',1,'\x01');
  local_8c = 0x1f9;
  bhdct_delete(tc,&dict,&local_8c,'\0',1,'\x01');
  local_90 = 0x3d;
  local_94 = 0x2c;
  bhdct_insert(tc,&dict,&local_90,&local_94,'\x01');
  local_98 = 0x43;
  local_9c = 0x2a;
  bhdct_insert(tc,&dict,&local_98,&local_9c,'\x01');
  local_a0 = 0x49;
  local_a4 = 0x30;
  bhdct_insert(tc,&dict,&local_a0,&local_a4,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_then_insert(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	bhdct_delete(tc, &dict, IONIZE(60, int), err_ok, 1, boolean_true);
	bhdct_delete(tc, &dict, IONIZE(4, int), err_ok, 1, boolean_true);
	bhdct_delete(tc, &dict, IONIZE(505, int), err_ok, 1, boolean_true);

	bhdct_insert(tc, &dict, IONIZE(61, int), IONIZE(44, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(67, int), IONIZE(42, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(73, int), IONIZE(48, int), boolean_true);

	bhdct_takedown(tc, &dict);
}